

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::python::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  char *pcVar1;
  FileDescriptor *pFVar2;
  bool bVar3;
  int iVar4;
  ZeroCopyOutputStream *output;
  LogMessage *other;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string filename;
  string module_name;
  Printer printer;
  FileDescriptorProto fdp;
  LogFinisher local_211;
  FileDescriptor *local_210;
  undefined1 local_208 [16];
  pointer local_1f8;
  string local_1e8;
  string local_1c8;
  Printer local_1a8;
  undefined1 local_108 [216];
  undefined4 extraout_var;
  
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (pointer)0x0;
  local_210 = file;
  ParseGeneratorParameter
            (parameter,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_208);
  if (local_208._8_8_ == local_208._0_8_) {
    bVar3 = true;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      iVar4 = std::__cxx11::string::compare
                        ((char *)((long)&(((pointer)local_208._0_8_)->first)._M_dataplus._M_p +
                                 lVar6));
      if (iVar4 != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108,"Unknown generator option: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_208._0_8_)->_M_dataplus)._M_p + lVar6));
        std::__cxx11::string::operator=((string *)error,(string *)local_108);
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_);
        }
        bVar5 = 0;
        goto LAB_0028541f;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x40;
    } while (uVar7 < (ulong)((long)(local_208._8_8_ - local_208._0_8_) >> 6));
    bVar3 = false;
  }
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this->file_ = local_210;
  anon_unknown_0::ModuleName(&local_1c8,*(string **)local_210);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,local_1c8._M_dataplus._M_p,
             local_1c8._M_dataplus._M_p + local_1c8._M_string_length);
  ReplaceCharacters(&local_1e8,".",'/');
  std::__cxx11::string::append((char *)&local_1e8);
  this->pure_python_workable_ = bVar3;
  pcVar1 = (char *)**(long **)local_210;
  uVar7 = (*(long **)local_210)[1];
  if ((long)uVar7 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(uVar7,"string length exceeds max size");
  }
  else if (uVar7 < 0x10) goto LAB_002850f4;
  auVar8[0] = -(*pcVar1 == 'g');
  auVar8[1] = -(pcVar1[1] == 'o');
  auVar8[2] = -(pcVar1[2] == 'o');
  auVar8[3] = -(pcVar1[3] == 'g');
  auVar8[4] = -(pcVar1[4] == 'l');
  auVar8[5] = -(pcVar1[5] == 'e');
  auVar8[6] = -(pcVar1[6] == '/');
  auVar8[7] = -(pcVar1[7] == 'p');
  auVar8[8] = -(pcVar1[8] == 'r');
  auVar8[9] = -(pcVar1[9] == 'o');
  auVar8[10] = -(pcVar1[10] == 't');
  auVar8[0xb] = -(pcVar1[0xb] == 'o');
  auVar8[0xc] = -(pcVar1[0xc] == 'b');
  auVar8[0xd] = -(pcVar1[0xd] == 'u');
  auVar8[0xe] = -(pcVar1[0xe] == 'f');
  auVar8[0xf] = -(pcVar1[0xf] == '/');
  if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf) ==
      0xffff) {
    this->pure_python_workable_ = true;
  }
LAB_002850f4:
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0,false);
  FileDescriptor::CopyTo(this->file_,(FileDescriptorProto *)local_108);
  MessageLite::SerializeToString((MessageLite *)local_108,&this->file_descriptor_serialized_);
  iVar4 = (*context->_vptr_GeneratorContext[2])(context,&local_1e8);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar4);
  if (output == (ZeroCopyOutputStream *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_1a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x157);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&local_1a8,"CHECK failed: output.get(): ");
    internal::LogFinisher::operator=(&local_211,other);
    internal::LogMessage::~LogMessage((LogMessage *)&local_1a8);
  }
  io::Printer::Printer(&local_1a8,output,'$');
  this->printer_ = &local_1a8;
  pFVar2 = this->file_;
  GeneratingDescriptorProto(this);
  io::Printer::Print<char[9],std::__cxx11::string>
            (&local_1a8,
             "# -*- coding: utf-8 -*-\n# Generated by the protocol buffer compiler.  DO NOT EDIT!\n# source: $filename$\n\"\"\"Generated protocol buffer code.\"\"\"\n"
             ,(char (*) [9])"filename",
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar2);
  if (0 < *(int *)(pFVar2 + 0x30)) {
    io::Printer::Print<>(&local_1a8,"from google.protobuf.internal import enum_type_wrapper\n");
  }
  io::Printer::Print<>
            (&local_1a8,
             "from google.protobuf import descriptor as _descriptor\nfrom google.protobuf import descriptor_pool as _descriptor_pool\nfrom google.protobuf import message as _message\nfrom google.protobuf import reflection as _reflection\nfrom google.protobuf import symbol_database as _symbol_database\n"
            );
  if ((0 < *(int *)(pFVar2 + 0x34)) && (*(char *)(*(long *)(pFVar2 + 0x78) + 0x9d) == '\x01')) {
    io::Printer::Print<>
              (&local_1a8,
               "from google.protobuf import service as _service\nfrom google.protobuf import service_reflection\n"
              );
  }
  io::Printer::Print<>
            (&local_1a8,
             "# @@protoc_insertion_point(imports)\n\n_sym_db = _symbol_database.Default()\n");
  io::Printer::Print<>(&local_1a8,"\n\n");
  if (this->pure_python_workable_ == true) {
    PrintImports(this);
  }
  PrintFileDescriptor(this);
  PrintTopLevelEnums(this);
  PrintTopLevelExtensions(this);
  if (this->pure_python_workable_ == true) {
    bVar3 = GeneratingDescriptorProto(this);
    if (bVar3) {
      io::Printer::Print<>(this->printer_,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
      io::Printer::Indent(this->printer_);
      PrintAllNestedEnumsInFile(this,kCreate);
      PrintMessageDescriptors(this,kCreate);
      FixForeignFieldsInDescriptors(this);
      io::Printer::Outdent(this->printer_);
      io::Printer::Print<>(this->printer_,"else:\n");
      io::Printer::Indent(this->printer_);
    }
    PrintMessageDescriptors(this,kFind);
    PrintAllNestedEnumsInFile(this,kFind);
    bVar3 = GeneratingDescriptorProto(this);
    if (bVar3) {
      io::Printer::Outdent(this->printer_);
    }
  }
  PrintMessages(this);
  if (this->pure_python_workable_ == true) {
    PrintServiceDescriptors(this);
    io::Printer::Print<>(&local_1a8,"if _descriptor._USE_C_DESCRIPTORS == False:\n");
    io::Printer::Indent(this->printer_);
    FixForeignFieldsInExtensions(this);
    FixAllDescriptorOptions(this);
    SetSerializedPbInterval(this);
    io::Printer::Outdent(this->printer_);
  }
  if ((0 < *(int *)(local_210 + 0x34)) && (*(char *)(*(long *)(local_210 + 0x78) + 0x9d) == '\x01'))
  {
    PrintServices(this);
  }
  io::Printer::Print<>(&local_1a8,"# @@protoc_insertion_point(module_scope)\n");
  io::Printer::~Printer(&local_1a8);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  bVar5 = local_1a8.failed_ ^ 1;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
LAB_0028541f:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_208);
  return (bool)bVar5;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file,
                         const std::string& parameter,
                         GeneratorContext* context, std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options
  bool cpp_generated_lib_linked = false;

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "cpp_generated_lib_linked") {
      cpp_generated_lib_linked = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // Completely serialize all Generate() calls on this instance.  The
  // thread-safety constraints of the CodeGenerator interface aren't clear so
  // just be as conservative as possible.  It's easier to relax this later if
  // we need to, but I doubt it will be an issue.
  // TODO(kenton):  The proper thing to do would be to allocate any state on
  //   the stack and use that, so that the Generator class itself does not need
  //   to have any mutable members.  Then it is implicitly thread-safe.
  MutexLock lock(&mutex_);
  file_ = file;
  std::string module_name = ModuleName(file->name());
  std::string filename = module_name;
  ReplaceCharacters(&filename, ".", '/');
  filename += ".py";

  pure_python_workable_ = !cpp_generated_lib_linked;
  if (HasPrefixString(file->name(), "google/protobuf/")) {
    pure_python_workable_ = true;
  }

  FileDescriptorProto fdp;
  file_->CopyTo(&fdp);
  fdp.SerializeToString(&file_descriptor_serialized_);


  std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
  GOOGLE_CHECK(output.get());
  io::Printer printer(output.get(), '$');
  printer_ = &printer;

  PrintTopBoilerplate(printer_, file_, GeneratingDescriptorProto());
  if (pure_python_workable_) {
    PrintImports();
  }
  PrintFileDescriptor();
  PrintTopLevelEnums();
  PrintTopLevelExtensions();
  if (pure_python_workable_) {
    if (GeneratingDescriptorProto()) {
      printer_->Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
      printer_->Indent();
      // Create enums before message descriptors
      PrintAllNestedEnumsInFile(StripPrintDescriptor::kCreate);
      PrintMessageDescriptors(StripPrintDescriptor::kCreate);
      FixForeignFieldsInDescriptors();
      printer_->Outdent();
      printer_->Print("else:\n");
      printer_->Indent();
    }
    // Find the message descriptors first and then use the message
    // descriptor to find enums.
    PrintMessageDescriptors(StripPrintDescriptor::kFind);
    PrintAllNestedEnumsInFile(StripPrintDescriptor::kFind);
    if (GeneratingDescriptorProto()) {
      printer_->Outdent();
    }
  }
  PrintMessages();
  if (pure_python_workable_) {
    PrintServiceDescriptors();

    printer.Print("if _descriptor._USE_C_DESCRIPTORS == False:\n");
    printer_->Indent();

    // We have to fix up the extensions after the message classes themselves,
    // since they need to call static RegisterExtension() methods on these
    // classes.
    FixForeignFieldsInExtensions();
    // Descriptor options may have custom extensions. These custom options
    // can only be successfully parsed after we register corresponding
    // extensions. Therefore we parse all options again here to recognize
    // custom options that may be unknown when we define the descriptors.
    // This does not apply to services because they are not used by extensions.
    FixAllDescriptorOptions();

    // Set serialized_start and serialized_end.
    SetSerializedPbInterval();

    printer_->Outdent();
  }
  if (HasGenericServices(file)) {
    PrintServices();
  }

  printer.Print("# @@protoc_insertion_point(module_scope)\n");

  return !printer.failed();
}